

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::load_simulation::test(load_simulation *this)

{
  mapped_type *pmVar1;
  element_type *peVar2;
  ulong uVar3;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  _Base_ptr local_168;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>
  local_160;
  allocator<char> local_151;
  string local_150;
  string local_130;
  _Base_ptr local_110;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>
  local_108;
  undefined4 local_100;
  allocator<char> local_f9;
  int sz;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  value_type local_6c [5];
  undefined1 local_58 [8];
  external_function ef;
  load_simulation *this_local;
  
  ef._64_8_ = this;
  compile_fixture::build_libs(&this->super_compile_fixture);
  (anonymous_namespace)::g_my_address = this;
  external_function::external_function((external_function *)local_58);
  std::__cxx11::string::operator=((string *)local_58,"my-address");
  ef.name.field_2._8_8_ = get_my_address;
  ef.arguments.
  super__Vector_base<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
           ::operator[](&(this->super_compile_fixture).externals,(key_type *)local_58);
  external_function::operator=(pmVar1,(external_function *)local_58);
  std::__cxx11::string::operator=((string *)local_58,"load-simulation");
  ef.name.field_2._8_8_ = scm_load_simulation;
  ef.arguments.
  super__Vector_base<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
  local_6c[1] = 3;
  std::vector<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
  ::push_back((vector<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
               *)&ef.address,local_6c + 1);
  local_6c[0] = T_CHAR_POINTER;
  std::vector<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
  ::push_back((vector<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
               *)&ef.address,local_6c);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
           ::operator[](&(this->super_compile_fixture).externals,(key_type *)local_58);
  external_function::operator=(pmVar1,(external_function *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"(define addr (foreign-call my-address))",&local_b1);
  compile_fixture::run(&local_90,&this->super_compile_fixture,&local_b0,true,6);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sz,"(foreign-call load-simulation addr \"13\")",&local_f9);
  compile_fixture::run(&local_d8,&this->super_compile_fixture,(string *)&sz,true,6);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&sz);
  std::allocator<char>::~allocator(&local_f9);
  peVar2 = std::
           __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_compile_fixture).env);
  local_108._M_node = (_Base_ptr)environment<skiwi::environment_entry>::begin_abi_cxx11_(peVar2);
  peVar2 = std::
           __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_compile_fixture).env);
  local_110 = (_Base_ptr)environment<skiwi::environment_entry>::end_abi_cxx11_(peVar2);
  uVar3 = std::
          distance<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
                    (local_108,
                     (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>
                      )local_110);
  local_100 = (undefined4)uVar3;
  printf("Environment has %d elements\n",uVar3 & 0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"(foreign-call load-simulation addr \"(define x 14)\")",&local_151
            );
  compile_fixture::run(&local_130,&this->super_compile_fixture,&local_150,true,6);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  peVar2 = std::
           __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_compile_fixture).env);
  local_160._M_node = (_Base_ptr)environment<skiwi::environment_entry>::begin_abi_cxx11_(peVar2);
  peVar2 = std::
           __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_compile_fixture).env);
  local_168 = (_Base_ptr)environment<skiwi::environment_entry>::end_abi_cxx11_(peVar2);
  uVar3 = std::
          distance<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
                    (local_160,
                     (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>
                      )local_168);
  local_100 = (undefined4)uVar3;
  printf("Environment has %d elements\n",uVar3 & 0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"x",&local_1a9);
  compile_fixture::run(&local_188,&this->super_compile_fixture,&local_1a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("14",&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1488,"void skiwi::(anonymous namespace)::load_simulation::test()");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  external_function::~external_function((external_function *)local_58);
  return;
}

Assistant:

void test()
      {
      build_libs();
      g_my_address = (uint64_t)this;

      external_function ef;
      ef.name = "my-address";
      ef.address = (uint64_t)&get_my_address;
      ef.return_type = external_function::T_INT64;
      externals[ef.name] = ef;

      ef.name = "load-simulation";
      ef.address = (uint64_t)&scm_load_simulation;
      ef.return_type = external_function::T_VOID;
      ef.arguments.push_back(external_function::T_INT64);
      ef.arguments.push_back(external_function::T_CHAR_POINTER);
      externals[ef.name] = ef;

      run("(define addr (foreign-call my-address))");
      run("(foreign-call load-simulation addr \"13\")");

      int sz = (int)std::distance(env->begin(), env->end());
      printf("Environment has %d elements\n", sz);

      run("(foreign-call load-simulation addr \"(define x 14)\")");

      sz = (int)std::distance(env->begin(), env->end());
      printf("Environment has %d elements\n", sz);

      TEST_EQ("14", run("x"));
      }